

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22ecb::RcExternMethodsInterfaceTest::TestComputeQPRateControl
          (RcExternMethodsInterfaceTest *this)

{
  bool bVar1;
  AomAV1RateControlRTC *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AomFrameDropDecision decision;
  AssertionResult gtest_ar;
  AomAV1RateControlRTC *controller;
  AomAV1RateControlRtcConfig *in_stack_ffffffffffffff68;
  AomAV1RateControlRTC *in_stack_ffffffffffffff70;
  AomAV1RateControlRTC **in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff9c;
  Type type;
  AssertHelper *in_stack_ffffffffffffffa0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffe8;
  
  in_RDI[0x628] = '\0';
  in_RDI[0x629] = '\0';
  in_RDI[0x62a] = '\0';
  in_RDI[0x62b] = '\0';
  in_RDI[0x62c] = '\0';
  in_RDI[0x62d] = '\0';
  in_RDI[0x62e] = '\0';
  in_RDI[0x62f] = '\0';
  in_RDI[0x624] = '\0';
  in_RDI[0x625] = '\0';
  in_RDI[0x626] = '\0';
  in_RDI[0x627] = '\0';
  this_00 = av1_ratecontrol_rtc_create(in_stack_ffffffffffffff68);
  testing::internal::CmpHelperNE<AomAV1RateControlRTC*,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI,
             in_stack_ffffffffffffff78,(void **)in_stack_ffffffffffffff70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff78 =
         (AomAV1RateControlRTC **)
         testing::AssertionResult::failure_message((AssertionResult *)0x139a67);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c,in_RDI);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)in_stack_ffffffffffffffe8._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff70);
    testing::Message::~Message((Message *)0x139ab5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139b18);
  if (bVar1) {
    av1_ratecontrol_rtc_compute_qp
              ((AomAV1RateControlRTC *)in_stack_ffffffffffffff68,(AomAV1FrameParamsRTC *)0x139b40);
    type = kSuccess;
    testing::internal::EqHelper::Compare<AomFrameDropDecision,_AomFrameDropDecision,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI,
               (AomFrameDropDecision *)in_stack_ffffffffffffff78,
               (AomFrameDropDecision *)in_stack_ffffffffffffff70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffffa0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffff70 =
           (AomAV1RateControlRTC *)
           testing::AssertionResult::failure_message((AssertionResult *)0x139ba8);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffffa0,type,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                 in_RDI);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_ffffffffffffffe8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff70);
      testing::Message::~Message((Message *)0x139bf6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x139c56);
    if (bVar1) {
      av1_ratecontrol_rtc_destroy(in_stack_ffffffffffffff70);
    }
  }
  return;
}

Assistant:

void RcExternMethodsInterfaceTest::TestComputeQPRateControl() {
  frame_params_.spatial_layer_id = 0;
  frame_params_.temporal_layer_id = 0;
  frame_params_.frame_type = kAomKeyFrame;

  AomAV1RateControlRTC *controller = av1_ratecontrol_rtc_create(&rc_cfg_);
  ASSERT_NE(controller, nullptr);

  const AomFrameDropDecision decision =
      av1_ratecontrol_rtc_compute_qp(controller, &frame_params_);
  ASSERT_EQ(decision, kAomFrameDropDecisionOk);
  av1_ratecontrol_rtc_destroy(controller);
}